

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void cmELFByteSwap(undefined1 *data)

{
  ushort *puVar1;
  undefined1 uVar2;
  
  uVar2 = *data;
  *data = data[3];
  data[3] = uVar2;
  puVar1 = (ushort *)(data + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}